

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,int field_number,_func_bool_int *is_valid,
               CodedOutputStream *unknown_fields_stream,RepeatedField<int> *values)

{
  bool bVar1;
  int iVar2;
  uint32 value_00;
  ulong uVar3;
  uint32 local_44;
  uint32 tag;
  int value;
  Limit limit;
  uint32 length;
  RepeatedField<int> *values_local;
  CodedOutputStream *unknown_fields_stream_local;
  _func_bool_int *is_valid_local;
  CodedInputStream *pCStack_18;
  int field_number_local;
  CodedInputStream *input_local;
  
  _limit = values;
  values_local = (RepeatedField<int> *)unknown_fields_stream;
  unknown_fields_stream_local = (CodedOutputStream *)is_valid;
  is_valid_local._4_4_ = field_number;
  pCStack_18 = input;
  bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&value);
  if (bVar1) {
    tag = io::CodedInputStream::PushLimit(pCStack_18,value);
    while (iVar2 = io::CodedInputStream::BytesUntilLimit(pCStack_18), 0 < iVar2) {
      bVar1 = ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (pCStack_18,(int *)&local_44);
      if (!bVar1) {
        return false;
      }
      if ((unknown_fields_stream_local == (CodedOutputStream *)0x0) ||
         (uVar3 = (*(code *)unknown_fields_stream_local)(local_44), (uVar3 & 1) != 0)) {
        RepeatedField<int>::Add(_limit,(int *)&local_44);
      }
      else {
        value_00 = MakeTag(is_valid_local._4_4_,WIRETYPE_VARINT);
        io::CodedOutputStream::WriteVarint32((CodedOutputStream *)values_local,value_00);
        io::CodedOutputStream::WriteVarint32((CodedOutputStream *)values_local,local_44);
      }
    }
    io::CodedInputStream::PopLimit(pCStack_18,tag);
    input_local._7_1_ = true;
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

bool WireFormatLite::ReadPackedEnumPreserveUnknowns(
    io::CodedInputStream* input,
    int field_number,
    bool (*is_valid)(int),
    io::CodedOutputStream* unknown_fields_stream,
    RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!google::protobuf::internal::WireFormatLite::ReadPrimitive<
        int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      uint32 tag = WireFormatLite::MakeTag(field_number,
                                           WireFormatLite::WIRETYPE_VARINT);
      unknown_fields_stream->WriteVarint32(tag);
      unknown_fields_stream->WriteVarint32(value);
    }
  }
  input->PopLimit(limit);
  return true;
}